

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Type> *
wasm::WATParser::reftype<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool bVar1;
  Type *u;
  allocator<char> local_e9;
  string local_e8;
  Err local_c8;
  uint local_a4;
  Err local_a0;
  Err *local_80;
  Err *err;
  undefined1 local_68 [8];
  MaybeResult<wasm::Type> _val;
  MaybeResult<wasm::Type> t;
  ParseDefsCtx *ctx_local;
  
  maybeReftype<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  if (bVar1) {
    MaybeResult<wasm::Type>::MaybeResult
              ((MaybeResult<wasm::Type> *)local_68,
               (MaybeResult<wasm::Type> *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    local_80 = MaybeResult<wasm::Type>::getErr((MaybeResult<wasm::Type> *)local_68);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::Type>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    local_a4 = (uint)bVar1;
    MaybeResult<wasm::Type>::~MaybeResult((MaybeResult<wasm::Type> *)local_68);
    if (local_a4 == 0) {
      u = MaybeResult<wasm::Type>::operator*
                    ((MaybeResult<wasm::Type> *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
      Result<wasm::Type>::Result<wasm::Type&>(__return_storage_ptr__,u);
      local_a4 = 1;
    }
  }
  else {
    local_a4 = 0;
  }
  MaybeResult<wasm::Type>::~MaybeResult
            ((MaybeResult<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  if (local_a4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"expected reftype",&local_e9);
    Lexer::err(&local_c8,&ctx->in,&local_e8);
    Result<wasm::Type>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> reftype(Ctx& ctx) {
  if (auto t = maybeReftype(ctx)) {
    CHECK_ERR(t);
    return *t;
  }
  return ctx.in.err("expected reftype");
}